

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

uchar * glfwGetJoystickButtons(int joy,int *count)

{
  uchar *puVar1;
  
  if (count == (int *)0x0) {
    __assert_fail("count != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/glfw-3.2.1/src/input.c"
                  ,0x23e,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  *count = 0;
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    if ((uint)joy < 0x10) {
      puVar1 = _glfwPlatformGetJoystickButtons(joy,count);
      return puVar1;
    }
    _glfwInputError(0x10003,"Invalid joystick %i");
  }
  return (uchar *)0x0;
}

Assistant:

char* glfwGetJoystickButtons(int joy, int* count)
{
    assert(count != NULL);
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (joy < 0 || joy > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick %i", joy);
        return NULL;
    }

    return _glfwPlatformGetJoystickButtons(joy, count);
}